

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O1

errr finish_parse_object(parser *p)

{
  ushort uVar1;
  undefined2 uVar2;
  void *pvVar3;
  angband_constants *paVar4;
  void *pvVar5;
  uint16_t uVar6;
  bitflag *pbVar7;
  ulong uVar8;
  long lVar9;
  
  z_info->k_max = 0;
  pvVar5 = parser_priv(p);
  if (pvVar5 != (void *)0x0) {
    uVar6 = z_info->k_max;
    do {
      uVar6 = uVar6 + 1;
      pvVar5 = *(void **)((long)pvVar5 + 0x18);
    } while (pvVar5 != (void *)0x0);
    z_info->k_max = uVar6;
  }
  k_info = (object_kind *)mem_zalloc((ulong)z_info->k_max * 0x2c0 + 0x2c0);
  uVar1 = z_info->k_max;
  pvVar5 = parser_priv(p);
  if (pvVar5 != (void *)0x0) {
    uVar8 = (ulong)uVar1;
    lVar9 = (ulong)uVar1 * 0x2c0;
    do {
      if ((long)uVar8 < 1) {
        __assert_fail("kidx >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/obj-init.c"
                      ,0x8b7,"errr finish_parse_object(struct parser *)");
      }
      memcpy(k_info[-1].flags + lVar9 + -0x80,pvVar5,0x2c0);
      pbVar7 = (bitflag *)((long)k_info + lVar9 + -0x23a);
      *(int *)((long)k_info + lVar9 + -0x2a0) = (int)(uVar8 - 1);
      flag_union(pbVar7,kb_info[*(int *)((long)pvVar5 + 0x24)].kind_flags,4);
      pvVar3 = *(void **)((long)pvVar5 + 0x18);
      pbVar7 = k_info->flags + lVar9 + -0x80;
      if ((long)(ulong)z_info->k_max <= (long)uVar8) {
        pbVar7 = (bitflag *)0x0;
      }
      *(bitflag **)((long)k_info + lVar9 + -0x2a8) = pbVar7;
      mem_free(pvVar5);
      uVar8 = uVar8 - 1;
      pvVar5 = pvVar3;
      lVar9 = lVar9 + -0x2c0;
    } while (pvVar3 != (void *)0x0);
  }
  paVar4 = z_info;
  uVar2 = z_info->k_max;
  z_info->k_max = uVar2 + 1;
  paVar4->ordinary_kind_max = uVar2 + 1;
  parser_destroy(p);
  return 0;
}

Assistant:

static errr finish_parse_object(struct parser *p) {
	struct object_kind *k, *next = NULL;
	int kidx;

	/* scan the list for the max id */
	z_info->k_max = 0;
	k = parser_priv(p);
	while (k) {
		z_info->k_max++;
		k = k->next;
	}

	/* allocate the direct access list and copy the data to it */
	k_info = mem_zalloc((z_info->k_max + 1) * sizeof(*k));
	kidx = z_info->k_max - 1;
	for (k = parser_priv(p); k; k = next, kidx--) {
		assert(kidx >= 0);

		memcpy(&k_info[kidx], k, sizeof(*k));
		k_info[kidx].kidx = kidx;

		/* Add base kind flags to kind kind flags */
		kf_union(k_info[kidx].kind_flags, kb_info[k->tval].kind_flags);

		next = k->next;
		if (kidx < z_info->k_max - 1) {
			k_info[kidx].next = &k_info[kidx + 1];
		} else {
			k_info[kidx].next = NULL;
		}
		mem_free(k);
	}
	z_info->k_max += 1;
	z_info->ordinary_kind_max = z_info->k_max;

	parser_destroy(p);
	return 0;
}